

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void __thiscall Assimp::glTF2Importer::ImportNodes(glTF2Importer *this,Asset *r)

{
  uint uVar1;
  vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *pvVar2;
  aiNode *this_00;
  aiNode **ppaVar3;
  aiNode *paVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> rootNodes;
  vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_> local_68;
  string local_50;
  
  pvVar2 = (r->scene).vector;
  if (pvVar2 != (vector<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_> *)0x0) {
    std::vector<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>::vector
              (&local_68,
               &(pvVar2->super__Vector_base<glTF2::Scene_*,_std::allocator<glTF2::Scene_*>_>).
                _M_impl.super__Vector_impl_data._M_start[(r->scene).index]->nodes);
    uVar6 = (long)local_68.
                  super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_68.
                  super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    uVar8 = uVar6 >> 4;
    iVar7 = (int)uVar8;
    if (iVar7 != 0) {
      if (iVar7 == 1) {
        this_00 = ImportNode(this->mScene,r,&this->meshOffsets,
                             local_68.
                             super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                             ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        this_00 = (aiNode *)operator_new(0x478);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"ROOT","");
        aiNode::aiNode(this_00,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppaVar3 = (aiNode **)operator_new__(uVar6 >> 1 & 0x7fffffff8);
        this_00->mChildren = ppaVar3;
        uVar8 = uVar8 & 0xffffffff;
        lVar5 = 0;
        do {
          paVar4 = ImportNode(this->mScene,r,&this->meshOffsets,
                              (Ref<glTF2::Node> *)
                              ((long)&(local_68.
                                       super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->vector + lVar5));
          paVar4->mParent = this_00;
          uVar1 = this_00->mNumChildren;
          this_00->mNumChildren = uVar1 + 1;
          this_00->mChildren[uVar1] = paVar4;
          lVar5 = lVar5 + 0x10;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      this->mScene->mRootNode = this_00;
    }
    if (local_68.
        super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (Ref<glTF2::Node> *)0x0) {
      operator_delete(local_68.
                      super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_68.
                            super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.
                            super__Vector_base<glTF2::Ref<glTF2::Node>,_std::allocator<glTF2::Ref<glTF2::Node>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

static inline void SetFace(aiFace& face, int a, int b)
{
    face.mNumIndices = 2;
    face.mIndices = new unsigned int[2];
    face.mIndices[0] = a;
    face.mIndices[1] = b;
}